

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::TextureSizeCase::TextureSizeCase
          (TextureSizeCase *this,Context *context,char *name,char *desc,char *samplerType,
          TextureSpec *texture,bool isVertexCase)

{
  long lVar1;
  TextureType *pTVar2;
  TextureSpec *pTVar3;
  byte bVar4;
  
  bVar4 = 0;
  TestCase::TestCase(&this->super_TestCase,context,name,"");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureSizeCase_00c0df18;
  this->m_samplerTypeStr = desc;
  pTVar2 = (TextureType *)samplerType;
  pTVar3 = &this->m_textureSpec;
  for (lVar1 = 0x15; lVar1 != 0; lVar1 = lVar1 + -1) {
    pTVar3->type = *pTVar2;
    pTVar2 = pTVar2 + (ulong)bVar4 * -2 + 1;
    pTVar3 = (TextureSpec *)((long)pTVar3 + (ulong)bVar4 * -8 + 4);
  }
  this->m_isVertexCase = SUB81(texture,0);
  this->m_has3DSize = (*(uint *)samplerType & 0xfffffffe) == 2;
  this->m_program = (ShaderProgram *)0x0;
  this->m_iterationCounter = 0;
  return;
}

Assistant:

TextureSizeCase::TextureSizeCase (Context& context, const char* name, const char* desc, const char* samplerType, const TextureSpec& texture, bool isVertexCase)
	: TestCase			(context, name, desc)
	, m_samplerTypeStr	(samplerType)
	, m_textureSpec		(texture)
	, m_isVertexCase	(isVertexCase)
	, m_has3DSize		(texture.type == TEXTURETYPE_3D || texture.type == TEXTURETYPE_2D_ARRAY)
	, m_program			(DE_NULL)
	, m_iterationCounter(0)
{
}